

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btRigidBody.cpp
# Opt level: O1

void __thiscall btRigidBody::addConstraintRef(btRigidBody *this,btTypedConstraint *c)

{
  uint uVar1;
  uint uVar2;
  btTypedConstraint **ptr;
  btTypedConstraint **ppbVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  int iVar7;
  btRigidBody *co;
  btRigidBody *this_00;
  
  uVar1 = (this->m_constraintRefs).m_size;
  if (0 < (int)uVar1) {
    uVar5 = 0;
    do {
      if ((this->m_constraintRefs).m_data[uVar5] == c) goto LAB_001b2a4a;
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  uVar5 = (ulong)uVar1;
LAB_001b2a4a:
  if ((uint)uVar5 != uVar1) {
    return;
  }
  uVar2 = (this->m_constraintRefs).m_capacity;
  if (uVar1 == uVar2) {
    iVar7 = 1;
    if ((ulong)uVar1 != 0) {
      iVar7 = uVar1 * 2;
    }
    if ((int)uVar2 < iVar7) {
      if (iVar7 == 0) {
        ppbVar3 = (btTypedConstraint **)0x0;
      }
      else {
        ppbVar3 = (btTypedConstraint **)btAlignedAllocInternal((long)iVar7 << 3,0x10);
      }
      lVar4 = (long)(this->m_constraintRefs).m_size;
      if (0 < lVar4) {
        lVar6 = 0;
        do {
          ppbVar3[lVar6] = (this->m_constraintRefs).m_data[lVar6];
          lVar6 = lVar6 + 1;
        } while (lVar4 != lVar6);
      }
      ptr = (this->m_constraintRefs).m_data;
      if (ptr != (btTypedConstraint **)0x0) {
        if ((this->m_constraintRefs).m_ownsMemory == true) {
          btAlignedFreeInternal(ptr);
        }
        (this->m_constraintRefs).m_data = (btTypedConstraint **)0x0;
      }
      (this->m_constraintRefs).m_ownsMemory = true;
      (this->m_constraintRefs).m_data = ppbVar3;
      (this->m_constraintRefs).m_capacity = iVar7;
    }
  }
  iVar7 = (this->m_constraintRefs).m_size;
  (this->m_constraintRefs).m_data[iVar7] = c;
  (this->m_constraintRefs).m_size = iVar7 + 1;
  this_00 = c->m_rbA;
  co = c->m_rbB;
  if (this_00 != this) {
    co = this_00;
    this_00 = c->m_rbB;
  }
  btCollisionObject::setIgnoreCollisionCheck
            (&this_00->super_btCollisionObject,&co->super_btCollisionObject,true);
  return;
}

Assistant:

void btRigidBody::addConstraintRef(btTypedConstraint* c)
{
	///disable collision with the 'other' body

	int index = m_constraintRefs.findLinearSearch(c);
	//don't add constraints that are already referenced
	//btAssert(index == m_constraintRefs.size());
	if (index == m_constraintRefs.size())
	{
		m_constraintRefs.push_back(c);
		btCollisionObject* colObjA = &c->getRigidBodyA();
		btCollisionObject* colObjB = &c->getRigidBodyB();
		if (colObjA == this)
		{
			colObjA->setIgnoreCollisionCheck(colObjB, true);
		}
		else
		{
			colObjB->setIgnoreCollisionCheck(colObjA, true);
		}
	} 
}